

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

Vec<Hpipe::Cond::Range> * __thiscall
Hpipe::Cond::ok_ranges_opt(Vec<Hpipe::Cond::Range> *__return_storage_ptr__,Cond *this,Cond *not_in)

{
  pointer pRVar1;
  Range *r;
  ulong uVar2;
  pointer pRVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *__filename;
  Range local_50;
  
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (not_in == (Cond *)0x0) {
    uVar2 = 0;
    while (local_50.beg = (int)uVar2, local_50.beg < 0x100) {
      uVar8 = (ulong)local_50.beg;
      if (((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
        uVar5 = -local_50.beg;
        do {
          uVar8 = uVar8 + 1;
          if (uVar8 == 0x100) {
            iVar4 = 0x100;
            local_50.end = 0xff;
            goto LAB_0014cd1f;
          }
          uVar5 = uVar5 - 1;
        } while (((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0);
        local_50.end = ~uVar5;
        iVar4 = -uVar5;
LAB_0014cd1f:
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_50.exceptions);
        local_50.beg = iVar4;
      }
      uVar2 = (ulong)(local_50.beg + 1);
    }
  }
  else {
    uVar2 = 0;
    while (iVar4 = (int)uVar2, iVar4 < 0x100) {
      uVar8 = (ulong)iVar4;
      if ((((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar2 & 0x3f) & 1) != 0) &&
         (((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] & 1L << ((byte)uVar2 & 0x3f)) == 0))
      {
        local_50.beg = iVar4 + 1;
        uVar2 = uVar8;
        do {
          uVar2 = uVar2 - 1;
          if (uVar2 == 0xffffffffffffffff) {
            local_50.beg = 0;
            break;
          }
          local_50.beg = local_50.beg + -1;
        } while (((not_in->p).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0);
        do {
          uVar5 = (uint)uVar8;
          if (0xfe < (long)uVar8) {
            local_50.end = 0xff;
            break;
          }
          uVar8 = uVar8 + 1;
        } while ((((this->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)
                || (local_50.end = uVar5,
                   ((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] &
                   1L << ((byte)uVar8 & 0x3f)) != 0));
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_50.exceptions.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>>::
        emplace_back<Hpipe::Cond::Range_const&>
                  ((vector<Hpipe::Cond::Range,std::allocator<Hpipe::Cond::Range>> *)
                   __return_storage_ptr__,&local_50);
        iVar4 = uVar5 + 1;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_50.exceptions);
      }
      uVar2 = (ulong)(iVar4 + 1);
    }
    pRVar1 = (__return_storage_ptr__->
             super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
             super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar3 = (__return_storage_ptr__->
                  super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>.
                  _M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
      uVar2 = (long)pRVar3->end + 1;
      uVar8 = (ulong)pRVar3->beg;
      if ((int)uVar2 - pRVar3->beg != 1) {
        uVar6 = 0xffffffff;
        for (; iVar4 = (int)uVar6, uVar2 != uVar8; uVar8 = uVar8 + 1) {
          if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) &&
             (uVar6 = uVar8 & 0xffffffff, -1 < iVar4)) goto LAB_0014ccb6;
        }
        pRVar3->beg = iVar4;
        pRVar3->end = iVar4;
      }
LAB_0014ccb6:
    }
  }
  __filename = (char *)0x1;
  while (pRVar3 = (__return_storage_ptr__->
                  super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                  super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        __filename <
        (char *)((long)(__return_storage_ptr__->
                       super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
                       super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 5)) {
    uVar5 = (uint)__filename;
    uVar7 = uVar5 - 1;
    local_50.beg = pRVar3[uVar7].end + 1;
    if ((1 < local_50.beg - pRVar3[uVar7].beg) &&
       (pRVar3[uVar7].end + 2 == pRVar3[(long)__filename].beg)) {
      std::vector<int,std::allocator<int>>::emplace_back<int_const&>
                ((vector<int,std::allocator<int>> *)&pRVar3[uVar7].exceptions,&local_50.beg);
      pRVar3 = (__return_storage_ptr__->
               super_vector<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>).
               super__Vector_base<Hpipe::Cond::Range,_std::allocator<Hpipe::Cond::Range>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar3[uVar7].end = pRVar3[(long)__filename].end;
      Vec<Hpipe::Cond::Range>::remove(__return_storage_ptr__,__filename);
      uVar5 = uVar7;
    }
    __filename = (char *)(ulong)(uVar5 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vec<Cond::Range> Cond::ok_ranges_opt( const Cond *not_in ) const {
    Vec<Range> ra;
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] and not (*not_in)[ i ] ) {
                // leftest beg
                int beg = i++;
                while ( beg and (*not_in)[ beg - 1 ] )
                    --beg;
                // rightest end
                while ( i < p_size and ( p[ i ] or (*not_in)[ i ] ) )
                    ++i;
                // register the interval
                ra << Range( beg, i - 1 );
            }
        }

        // reduction of ranges with only 1 not not_in
        for( Range &r : ra ) {
            if ( r.size() == 1 )
                continue;
            for( int i = r.beg, p = -1; ; ++i ) {
                if ( i == r.end + 1 ) {
                    r.beg = p;
                    r.end = p;
                    break;
                }
                if ( not (*not_in)[ i ] ) {
                    if ( p >= 0 )
                        break;
                    p = i;
                }
            }
        }
    } else {
        for( int i = 0; i < p_size; ++i ) {
            // beginning if a Range
            if ( p[ i ] ) {
                int beg = i++;
                while ( i < p_size and p[ i ] )
                    ++i;
                ra << Range( beg, i - 1 );
            }
        }
    }

    // [ ... x - 1 ] | [ x + 1 ... ] if cardinal first interval > 1
    for( unsigned i = 1; i < ra.size(); ++i ) {
        if ( ra[ i - 1 ].size() >= 2 and ra[ i - 1 ].end + 2 == ra[ i ].beg ) {
            ra[ i - 1 ].exceptions << ra[ i - 1 ].end + 1;
            ra[ i - 1 ].end = ra[ i ].end;
            ra.remove( i-- );
        }
    }

    return ra;
}